

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::Q3BSPFileImporter::CreateDataFromImport
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,ZipArchiveIOSystem *pArchive)

{
  aiNode *this_00;
  ulong uVar1;
  ZipArchiveIOSystem *pArchive_local;
  aiScene *pScene_local;
  Q3BSPModel *pModel_local;
  Q3BSPFileImporter *this_local;
  
  if ((pModel != (Q3BSPModel *)0x0) && (pScene != (aiScene *)0x0)) {
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    pScene->mRootNode = this_00;
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      aiString::Set(&pScene->mRootNode->mName,&pModel->m_ModelName);
    }
    createMaterialMap(this,pModel);
    CreateNodes(this,pModel,pScene,pScene->mRootNode);
    createMaterials(this,pModel,pScene,pArchive);
  }
  return;
}

Assistant:

void Q3BSPFileImporter::CreateDataFromImport( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
    ZipArchiveIOSystem *pArchive ) {
    if (nullptr == pModel || nullptr == pScene) {
        return;
    }

    pScene->mRootNode = new aiNode;
    if ( !pModel->m_ModelName.empty() ) {
        pScene->mRootNode->mName.Set( pModel->m_ModelName );
    }

    // Create the face to material relation map
    createMaterialMap( pModel );

    // Create all nodes
    CreateNodes( pModel, pScene, pScene->mRootNode );

    // Create the assigned materials
    createMaterials( pModel, pScene, pArchive );
}